

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SRes LzmaDec_AllocateProbs(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  byte bVar1;
  bool bVar2;
  SRes SVar3;
  UInt16 *pUVar4;
  ulong uVar5;
  uint unaff_R12D;
  uint uVar6;
  uint unaff_R15D;
  uint local_40;
  UInt32 local_34;
  
  local_40 = (uint)alloc;
  SVar3 = 4;
  if (propsSize < 5) {
LAB_00112fd1:
    bVar2 = false;
  }
  else {
    uVar5 = 0x1000;
    if (0x1000 < *(uint *)(props + 1)) {
      uVar5 = (ulong)*(uint *)(props + 1);
    }
    local_34 = (UInt32)uVar5;
    bVar1 = *props;
    local_40 = (uint)CONCAT71((int7)(uVar5 >> 8),bVar1);
    if (0xe0 < bVar1) goto LAB_00112fd1;
    uVar6 = bVar1 / 9;
    unaff_R15D = (uint)(byte)(bVar1 + (char)uVar6 * -9);
    local_40 = uVar6 / 5;
    unaff_R12D = uVar6 % 5;
    bVar2 = true;
    SVar3 = 0;
  }
  if (!bVar2) {
    return SVar3;
  }
  uVar6 = (0x300 << ((char)unaff_R15D + (char)unaff_R12D & 0x1fU)) + 0x736;
  if ((p->probs == (UInt16 *)0x0) || (uVar6 != p->numProbs)) {
    (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->probs);
    p->probs = (UInt16 *)0x0;
    pUVar4 = (UInt16 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)uVar6 * 2);
    p->probs = pUVar4;
    p->numProbs = uVar6;
    if (pUVar4 == (UInt16 *)0x0) {
      SVar3 = 2;
      bVar2 = false;
      goto LAB_00113073;
    }
  }
  SVar3 = 0;
  bVar2 = true;
LAB_00113073:
  if (bVar2) {
    (p->prop).lc = unaff_R15D;
    (p->prop).lp = unaff_R12D;
    (p->prop).pb = local_40;
    (p->prop).dicSize = local_34;
    SVar3 = 0;
  }
  return SVar3;
}

Assistant:

static SRes LzmaDec_AllocateProbs(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  p->prop = propNew;
  return SZ_OK;
}